

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ pRVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  REF_STATUS ref_private_macro_code_rxs;
  uint uVar9;
  bool bVar10;
  double dVar11;
  REF_DBL RVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  REF_DBL RVar16;
  REF_INT nodes [2];
  REF_INT id;
  REF_NODE local_230;
  double local_228;
  double local_220;
  REF_INT sense;
  REF_BOOL geom_node1;
  REF_BOOL geom_node0;
  REF_INTERP local_208;
  REF_DBL t_orig;
  REF_DBL q;
  int local_1f0;
  REF_INT nnode;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  long local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c0;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL t;
  REF_DBL min_uv_area;
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL r1orig;
  REF_DBL r0orig;
  REF_DBL r1;
  REF_DBL r0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL tangent [3];
  REF_DBL dxyz [3];
  REF_DBL total_force [3];
  REF_DBL q_orig;
  REF_DBL dxyz_dt [6];
  REF_DBL xyz_orig [3];
  REF_INT edge_nodes [27];
  
  pRVar2 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  local_208 = ref_grid->interp;
  if ((-1 < node) &&
     (((((pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)) ||
        ((pRVar3 = ref_grid->cell[9]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)))) ||
       ((pRVar3 = ref_grid->cell[10]->ref_adj, node < pRVar3->nnode &&
        (pRVar3->first[(uint)node] != -1)))) ||
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, node < pRVar3->nnode &&
       (pRVar3->first[(uint)node] != -1)))))) {
    return 0;
  }
  uVar4 = ref_geom_is_a(ref_geom,node,0,&geom_node);
  if (uVar4 != 0) {
    pcVar8 = "node check";
    uVar7 = 0x606;
    goto LAB_001ee364;
  }
  local_230 = pRVar2;
  uVar4 = ref_geom_is_a(ref_geom,node,1,&geom_edge);
  if (uVar4 != 0) {
    pcVar8 = "edge check";
    uVar7 = 0x607;
    goto LAB_001ee3b5;
  }
  if (geom_node != 0) {
    pcVar8 = "geom node not allowed";
    uVar7 = 0x608;
LAB_001ee3ec:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar7,
           "ref_smooth_geom_edge",pcVar8);
    return 1;
  }
  if (geom_edge == 0) {
    pcVar8 = "geom edge required";
    uVar7 = 0x609;
    goto LAB_001ee3ec;
  }
  uVar4 = ref_geom_unique_id(ref_geom,node,1,&id);
  if (uVar4 != 0) {
    pcVar8 = "get id";
    uVar7 = 0x60b;
    goto LAB_001ee3b5;
  }
  uVar4 = ref_cell_node_list_around(ref_cell,node,2,&nnode,nodes);
  if (uVar4 != 0) {
    pcVar8 = "edge neighbors";
    uVar7 = 0x60c;
    goto LAB_001ee3b5;
  }
  if ((long)nnode != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x60d,
           "ref_smooth_geom_edge","expected two nodes",2,(long)nnode);
    return 1;
  }
  uVar4 = ref_geom_is_a(ref_geom,nodes[0],0,&geom_node0);
  if (uVar4 != 0) {
    pcVar8 = "node0";
    uVar7 = 0x610;
    goto LAB_001ee364;
  }
  uVar4 = ref_geom_is_a(ref_geom,nodes[1],0,&geom_node1);
  if (uVar4 != 0) {
    pcVar8 = "node1";
    uVar7 = 0x611;
    goto LAB_001ee364;
  }
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    total_force[lVar6] = 0.0;
  }
  if ((geom_node1 == 0) || (geom_node0 != 0)) {
    uVar4 = ref_smooth_add_pliant_force(local_230,node,nodes[0],total_force);
    if (uVar4 != 0) {
      pcVar8 = "n0";
      uVar7 = 0x616;
      goto LAB_001ee364;
    }
    if ((geom_node0 == 0) || (geom_node1 != 0)) goto LAB_001ee5a3;
  }
  else {
LAB_001ee5a3:
    uVar4 = ref_smooth_add_pliant_force(local_230,node,nodes[1],total_force);
    if (uVar4 != 0) {
      pcVar8 = "n1";
      uVar7 = 0x619;
      goto LAB_001ee364;
    }
  }
  dVar11 = ref_grid->adapt->smooth_pliant_alpha;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    dxyz[lVar6] = total_force[lVar6] * dVar11;
  }
  edge_nodes[0] = nodes[0];
  edge_nodes[2] = id;
  edge_nodes[1] = node;
  uVar4 = ref_geom_cell_tuv(ref_geom,nodes[0],edge_nodes,1,&t0,&sense);
  if (uVar4 == 0) {
    uVar4 = ref_geom_cell_tuv(ref_geom,node,edge_nodes,1,&t_orig,&sense);
    if (uVar4 == 0) {
      edge_nodes[0] = nodes[1];
      edge_nodes[2] = id;
      edge_nodes[1] = node;
      uVar4 = ref_geom_cell_tuv(ref_geom,nodes[1],edge_nodes,1,&t1,&sense);
      if (uVar4 == 0) {
        uVar4 = ref_egads_eval_at(ref_geom,1,id,&t_orig,xyz_orig,dxyz_dt);
        if (uVar4 == 0) {
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            tangent[lVar6] = dxyz_dt[lVar6];
          }
          local_220 = dxyz_dt[0];
          local_228 = dxyz_dt[1];
          local_1d8 = dxyz_dt[2];
          uVar4 = ref_math_normalize(tangent);
          if (uVar4 == 0) {
            dVar11 = SQRT(local_1d8 * local_1d8 + local_220 * local_220 + local_228 * local_228);
            dVar15 = dxyz[2] * tangent[2] + dxyz[0] * tangent[0] + dxyz[1] * tangent[1];
            auVar13._0_8_ = dVar11 * 1e+20;
            auVar13._8_8_ = dVar15;
            auVar14._8_8_ = -dVar15;
            auVar14._0_8_ = -auVar13._0_8_;
            auVar14 = maxpd(auVar13,auVar14);
            if (auVar14._0_8_ <= auVar14._8_8_) {
              pcVar8 = "unable to invert dt/dxyz";
              uVar4 = 4;
              uVar7 = 0x642;
            }
            else {
              local_1d8 = dVar15 / dVar11 + t_orig;
              RVar12 = t0;
              if (t1 <= t0) {
                RVar12 = t1;
              }
              uStack_1d0 = 0;
              if (local_1d8 < RVar12) {
                return 0;
              }
              if (t0 <= t1) {
                t0 = t1;
              }
              if (t0 < local_1d8) {
                return 0;
              }
              uVar4 = ref_node_ratio(local_230,nodes[0],node,&r0orig);
              if (uVar4 == 0) {
                uVar4 = ref_node_ratio(local_230,nodes[1],node,&r1orig);
                if (uVar4 == 0) {
                  if ((ref_grid->surf == 0) &&
                     (uVar4 = ref_smooth_tet_quality_around(ref_grid,node,&q_orig), uVar4 != 0)) {
                    pcVar8 = "q_orig";
                    uVar7 = 0x655;
                  }
                  else {
                    uVar4 = ref_smooth_tri_normdev_around(ref_grid,node,&normdev_orig);
                    if (uVar4 == 0) {
                      local_228 = (double)CONCAT44(local_228._4_4_,0xffffffff);
                      local_1e0 = (long)node;
                      if ((local_208 != (REF_INTERP)0x0) && (local_208->continuously != 0)) {
                        local_228 = (double)CONCAT44(local_228._4_4_,local_208->cell[local_1e0]);
                      }
                      local_1c0 = normdev_orig;
                      local_1f0 = 8;
                      local_220 = 1.0;
                      uVar9 = 0;
                      while (bVar10 = local_1f0 != 0, local_1f0 = local_1f0 + -1, bVar10) {
                        t = local_220 * local_1d8 + (1.0 - local_220) * t_orig;
                        uVar4 = ref_geom_add(ref_geom,node,1,id,&t);
                        if (uVar4 != 0) {
                          pcVar8 = "set t";
                          uVar7 = 0x66a;
                          goto LAB_001ee3b5;
                        }
                        uVar4 = ref_geom_constrain(ref_grid,node);
                        if (uVar4 != 0) {
                          pcVar8 = "constrain";
                          uVar7 = 0x66b;
                          goto LAB_001ee3b5;
                        }
                        uVar5 = ref_metric_interpolate_node(ref_grid,node);
                        if ((uVar5 != 0) && (uVar5 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x66d,"ref_smooth_geom_edge",(ulong)uVar5,
                                 "ref_metric_interpolate_node failed");
                          uVar9 = uVar5;
                        }
                        if ((uVar5 != 5) && (uVar5 != 0)) {
                          return uVar9;
                        }
                        uVar4 = ref_node_ratio(local_230,nodes[0],node,&r0);
                        if (uVar4 != 0) {
                          pcVar8 = "get r0";
                          uVar7 = 0x66e;
                          goto LAB_001ee3b5;
                        }
                        uVar4 = ref_node_ratio(local_230,nodes[1],node,&r1);
                        if (uVar4 != 0) {
                          pcVar8 = "get r1";
                          uVar7 = 0x66f;
                          goto LAB_001ee3b5;
                        }
                        if (ref_grid->surf == 0) {
                          uVar4 = ref_smooth_tet_quality_around(ref_grid,node,&q);
                          if (uVar4 != 0) {
                            pcVar8 = "q";
                            uVar7 = 0x675;
                            goto LAB_001ee3b5;
                          }
                          uVar4 = ref_smooth_tet_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
                          if (uVar4 != 0) {
                            pcVar8 = "ratio";
                            uVar7 = 0x677;
                            goto LAB_001ee3b5;
                          }
                        }
                        else {
                          q = 1.0;
                          uVar4 = ref_smooth_tri_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
                          if (uVar4 != 0) {
                            pcVar8 = "ratio";
                            uVar7 = 0x673;
                            goto LAB_001ee3b5;
                          }
                        }
                        uVar4 = ref_smooth_tri_normdev_around(ref_grid,node,&normdev);
                        if (uVar4 != 0) {
                          pcVar8 = "nd";
                          uVar7 = 0x679;
                          goto LAB_001ee3b5;
                        }
                        uVar4 = ref_smooth_tri_uv_area_around(ref_grid,node,&min_uv_area);
                        if (uVar4 != 0) {
                          pcVar8 = "a";
                          uVar7 = 0x67a;
                          goto LAB_001ee3b5;
                        }
                        pRVar1 = &ref_grid->adapt->smooth_min_quality;
                        if ((*pRVar1 <= q && q != *pRVar1) &&
                           (((pRVar1 = &ref_grid->adapt->post_min_normdev,
                             *pRVar1 <= normdev && normdev != *pRVar1 || (local_1c0 < normdev)) &&
                            (local_230->min_uv_area <= min_uv_area &&
                             min_uv_area != local_230->min_uv_area)))) {
                          RVar12 = r0;
                          if (r1 <= r0) {
                            RVar12 = r1;
                          }
                          RVar16 = r0orig;
                          if (r1orig <= r0orig) {
                            RVar16 = r1orig;
                          }
                          if (RVar16 * 0.9 < RVar12) {
                            RVar12 = r0;
                            if (r0 <= r1) {
                              RVar12 = r1;
                            }
                            dVar11 = r0orig;
                            if (r0orig <= r1orig) {
                              dVar11 = r1orig;
                            }
                            if (RVar12 < dVar11 * 1.1) {
                              return 0;
                            }
                          }
                        }
                        local_220 = local_220 * 0.5;
                        if (uVar5 != 0 && local_228._0_4_ != -1) {
                          local_208->cell[local_1e0] = local_228._0_4_;
                        }
                      }
                      uVar4 = ref_geom_add(ref_geom,node,1,id,&t_orig);
                      if (uVar4 == 0) {
                        uVar4 = ref_geom_constrain(ref_grid,node);
                        if (uVar4 == 0) {
                          uVar4 = ref_metric_interpolate_node(ref_grid,node);
                          if ((uVar4 != 0) && (uVar4 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x68e,"ref_smooth_geom_edge",(ulong)uVar4,"interp");
                            uVar9 = uVar4;
                          }
                          if ((uVar4 != 5) && (uVar4 != 0)) {
                            return uVar9;
                          }
                          if (ref_grid->surf != 0) {
                            return 0;
                          }
                          uVar4 = ref_smooth_tet_quality_around(ref_grid,node,&q);
                          if (uVar4 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x693,"ref_smooth_geom_edge",(ulong)uVar4,"q");
                            return uVar4;
                          }
                          return 0;
                        }
                        pcVar8 = "constrain";
                        uVar7 = 0x68d;
                      }
                      else {
                        pcVar8 = "set t";
                        uVar7 = 0x68c;
                      }
LAB_001ee3b5:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,uVar7,"ref_smooth_geom_edge",(ulong)uVar4,pcVar8);
                      return uVar4;
                    }
                    pcVar8 = "nd_orig";
                    uVar7 = 0x657;
                  }
                }
                else {
                  pcVar8 = "get r1";
                  uVar7 = 0x651;
                }
              }
              else {
                pcVar8 = "get r0";
                uVar7 = 0x650;
              }
            }
          }
          else {
            pcVar8 = "form tangent";
            uVar7 = 0x63d;
          }
        }
        else {
          pcVar8 = "eval edge derivatives";
          uVar7 = 0x63a;
        }
LAB_001ee364:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar7,"ref_smooth_geom_edge",(ulong)uVar4,pcVar8);
        return uVar4;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x636,"ref_smooth_geom_edge",(ulong)uVar4,"get t1");
      ref_node_location(local_230,nodes[1]);
      node = nodes[1];
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x62d,"ref_smooth_geom_edge",(ulong)uVar4,"get t_orig");
      ref_node_location(local_230,node);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x627,
           "ref_smooth_geom_edge",(ulong)uVar4,"get t0");
    ref_node_location(local_230,nodes[0]);
    node = nodes[0];
  }
  ref_geom_tattle(ref_geom,node);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_BOOL geom_node, geom_node0, geom_node1, geom_edge;
  REF_INT id;
  REF_INT nodes[2], nnode;
  REF_DBL t_orig, t0, t1;
  REF_DBL r0, r1, r0orig, r1orig;
  REF_DBL q_orig;
  REF_DBL normdev_orig, normdev;
  REF_DBL min_uv_area;

  REF_INT ixyz;
  REF_DBL total_force[3];
  REF_DBL dxyz[3], dxyz_dt[6], xyz_orig[3], dt, dt_ds, tangent[3];

  REF_DBL t, q, backoff, t_target, min_ratio, max_ratio;
  REF_INT tries;
  REF_BOOL verbose = REF_FALSE;
  REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER], sense;

  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL accept;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RAS(!geom_node, "geom node not allowed");
  RAS(geom_edge, "geom edge required");

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_EDGE, &id), "get id");
  RSS(ref_cell_node_list_around(edg, node, 2, &nnode, nodes), "edge neighbors");
  REIS(2, nnode, "expected two nodes");

  /* if node0 or node1 constrained by geometry, give precedence */
  RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_NODE, &geom_node0), "node0");
  RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_NODE, &geom_node1), "node1");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  if (!geom_node1 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[0], total_force),
        "n0");
  if (!geom_node0 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[1], total_force),
        "n1");

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  edge_nodes[0] = nodes[0];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[0], edge_nodes, REF_GEOM_EDGE, &t0,
                        &sense),
      "get t0", {
        ref_node_location(ref_node, nodes[0]);
        ref_geom_tattle(ref_geom, nodes[0]);
      });
  RSB(ref_geom_cell_tuv(ref_geom, node, edge_nodes, REF_GEOM_EDGE, &t_orig,
                        &sense),
      "get t_orig", {
        ref_node_location(ref_node, node);
        ref_geom_tattle(ref_geom, node);
      });
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[1], edge_nodes, REF_GEOM_EDGE, &t1,
                        &sense),
      "get t1", {
        ref_node_location(ref_node, nodes[1]);
        ref_geom_tattle(ref_geom, nodes[1]);
      });

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &t_orig, xyz_orig,
                        dxyz_dt),
      "eval edge derivatives");
  for (ixyz = 0; ixyz < 3; ixyz++) tangent[ixyz] = dxyz_dt[ixyz];
  dt_ds = sqrt(ref_math_dot(dxyz_dt, dxyz_dt));
  RSS(ref_math_normalize(tangent), "form tangent");
  dt = ref_math_dot(dxyz, tangent);
  if (ref_math_divisible(dt, dt_ds)) {
    dt /= dt_ds;
  } else {
    RSS(REF_DIV_ZERO, "unable to invert dt/dxyz");
  }
  t_target = t_orig + dt;

  /* reject a smooth point candidate outside of trange */
  if (t_target < MIN(t0, t1) || MAX(t0, t1) < t_target) {
    return REF_SUCCESS;
  }

  if (verbose) {
    printf("dxyz %f %f %f\n", dxyz[0], dxyz[1], dxyz[2]);
    printf("dxyz_dt %f %f %f\n", dxyz_dt[0], dxyz_dt[1], dxyz_dt[2]);
  }

  RSS(ref_node_ratio(ref_node, nodes[0], node, &r0orig), "get r0");
  RSS(ref_node_ratio(ref_node, nodes[1], node, &r1orig), "get r1");
  if (ref_grid_surf(ref_grid)) {
    q_orig = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q_orig), "q_orig");
  }
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose) printf("edge %d t %f %f %f q %f\n", id, t0, t_orig, t1, q_orig);

  if (verbose)
    printf("t_target %f at %f %f %f\n", t_target,
           ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
           ref_node_xyz(ref_node, 2, node));

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    t = backoff * t_target + (1.0 - backoff) * t_orig;

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t), "set t");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_node_ratio(ref_node, nodes[0], node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, nodes[1], node, &r1), "get r1");
    if (ref_grid_surf(ref_grid)) {
      q = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (q > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (MIN(r0, r1) > 0.9 * MIN(r0orig, r1orig));
    accept = accept && (MAX(r0, r1) < 1.1 * MAX(r0orig, r1orig));

    if (verbose) printf("t %f r %f %f q %f \n", t, r0, r1, q);
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (ref_grid_surf(ref_grid)) {
    q = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
  }
  if (verbose) printf("undo q %f\n", q);

  return REF_SUCCESS;
}